

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_psbt.cpp
# Opt level: O2

PsbtOutputDataStruct *
cfd::js::api::PsbtStructApi::CombinePsbt
          (PsbtOutputDataStruct *__return_storage_ptr__,PsbtListStruct *request)

{
  string *in_R8;
  allocator local_139;
  _Any_data local_138;
  code *local_128;
  code *local_120;
  function<cfd::js::api::PsbtOutputDataStruct_(const_cfd::js::api::PsbtListStruct_&)> local_118;
  PsbtOutputDataStruct local_f8;
  
  PsbtOutputDataStruct::PsbtOutputDataStruct(__return_storage_ptr__);
  local_138._M_unused._M_object = (void *)0x0;
  local_138._8_8_ = 0;
  local_120 = std::
              _Function_handler<cfd::js::api::PsbtOutputDataStruct_(const_cfd::js::api::PsbtListStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_psbt.cpp:761:7)>
              ::_M_invoke;
  local_128 = std::
              _Function_handler<cfd::js::api::PsbtOutputDataStruct_(const_cfd::js::api::PsbtListStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_psbt.cpp:761:7)>
              ::_M_manager;
  std::__cxx11::string::string((string *)&local_118,"CombinePsbt",&local_139);
  ExecuteStructApi<cfd::js::api::PsbtListStruct,cfd::js::api::PsbtOutputDataStruct>
            (&local_f8,(api *)request,(PsbtListStruct *)&local_138,&local_118,in_R8);
  PsbtOutputDataStruct::operator=(__return_storage_ptr__,&local_f8);
  PsbtOutputDataStruct::~PsbtOutputDataStruct(&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  std::_Function_base::~_Function_base((_Function_base *)&local_138);
  return __return_storage_ptr__;
}

Assistant:

PsbtOutputDataStruct PsbtStructApi::CombinePsbt(
    const PsbtListStruct& request) {
  auto call_func =
      [](const PsbtListStruct& request) -> PsbtOutputDataStruct {  // NOLINT
    if (request.psbts.empty()) {
      warn(CFD_LOG_SOURCE, "psbt list is empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "psbt list is empty.");
    }
    Psbt psbt;
    GetPsbtFromString(request.psbts.at(0), "CombinePsbt", &psbt);

    for (size_t index = 1; index < request.psbts.size(); ++index) {
      Psbt append_psbt;
      GetPsbtFromString(request.psbts.at(index), "CombinePsbt", &append_psbt);
      psbt.Combine(append_psbt);
    }

    PsbtOutputDataStruct response;
    response.psbt = psbt.GetBase64();
    response.hex = psbt.GetData().GetHex();
    return response;
  };

  PsbtOutputDataStruct result;
  result = ExecuteStructApi<PsbtListStruct, PsbtOutputDataStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}